

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  cmFileListGeneratorBase *p;
  cmFileListGeneratorBase *in_RAX;
  cmFileListGeneratorBase *local_18;
  
  local_18 = in_RAX;
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_18);
  p = local_18;
  local_18 = (cmFileListGeneratorBase *)0x0;
  cmsys::auto_ptr<cmFileListGeneratorBase>::reset(&this->Next,p);
  if (local_18 != (cmFileListGeneratorBase *)0x0) {
    (*local_18->_vptr_cmFileListGeneratorBase[1])();
  }
  return (this->Next).x_;
}

Assistant:

cmFileListGeneratorBase*
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}